

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sumsurface.cpp
# Opt level: O3

bool __thiscall
ON_SumSurface::GetBBox(ON_SumSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_BoundingBox *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  ulong uVar6;
  uint uVar7;
  ON_SumSurface *pS;
  ON_BoundingBox bboxA;
  ON_BoundingBox bboxB;
  ON_BoundingBox local_e8;
  ON_SumSurface *local_b8;
  ON_3dPoint local_b0;
  ON_BoundingBox local_98;
  ON_BoundingBox local_60;
  
  this_00 = &this->m_bbox;
  bVar2 = ON_BoundingBox::IsValid(this_00);
  if (!bVar2) {
    ON_BoundingBox::ON_BoundingBox(&local_e8);
    ON_BoundingBox::ON_BoundingBox(&local_98);
    if (this->m_curve[0] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_60,&this->m_curve[0]->super_ON_Geometry);
      local_e8.m_max.y = local_60.m_max.y;
      local_e8.m_max.z = local_60.m_max.z;
      local_e8.m_min.z = local_60.m_min.z;
      local_e8.m_max.x = local_60.m_max.x;
      local_e8.m_min.x = local_60.m_min.x;
      local_e8.m_min.y = local_60.m_min.y;
    }
    if (this->m_curve[1] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_60,&this->m_curve[1]->super_ON_Geometry);
      local_98.m_max.y = local_60.m_max.y;
      local_98.m_max.z = local_60.m_max.z;
      local_98.m_min.z = local_60.m_min.z;
      local_98.m_max.x = local_60.m_max.x;
      local_98.m_min.x = local_60.m_min.x;
      local_98.m_min.y = local_60.m_min.y;
    }
    bVar2 = ON_BoundingBox::IsValid(&local_e8);
    if ((bVar2) && (bVar2 = ON_BoundingBox::IsValid(&local_98), bVar2)) {
      ON_3dPoint::operator+(&local_b0,&local_e8.m_min,&local_98.m_min);
      ON_3dPoint::operator+(&local_60.m_min,&local_b0,&this->m_basepoint);
      (this->m_bbox).m_min.z = local_60.m_min.z;
      (this_00->m_min).x = local_60.m_min.x;
      (this->m_bbox).m_min.y = local_60.m_min.y;
      ON_3dPoint::operator+(&local_b0,&local_e8.m_max,&local_98.m_max);
      ON_3dPoint::operator+(&local_60.m_min,&local_b0,&this->m_basepoint);
      (this->m_bbox).m_max.z = local_60.m_min.z;
      (this->m_bbox).m_max.x = local_60.m_min.x;
      (this->m_bbox).m_max.y = local_60.m_min.y;
    }
    bVar2 = ON_BoundingBox::IsValid(this_00);
    if (!bVar2) {
      return false;
    }
  }
  iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
  ON_BoundingBox::ON_BoundingBox(&local_e8);
  if (boxmax == (double *)0x0 || (!bGrowBox || boxmin == (double *)0x0)) {
    local_e8.m_min.x = (this_00->m_min).x;
    local_e8.m_min.y = (this->m_bbox).m_min.y;
    local_e8.m_min.z = (this->m_bbox).m_min.z;
    local_e8.m_max.x = (this->m_bbox).m_max.x;
    local_e8.m_max.y = (this->m_bbox).m_max.y;
    local_e8.m_max.z = (this->m_bbox).m_max.z;
  }
  else {
    local_b8 = this;
    if (0 < iVar3) {
      uVar4 = 2;
      if (iVar3 - 1U < 2) {
        uVar4 = iVar3 - 1U;
      }
      uVar6 = 0;
      do {
        dVar1 = boxmin[uVar6];
        pdVar5 = ON_3dPoint::operator[](&local_e8.m_min,(int)uVar6);
        *pdVar5 = dVar1;
        dVar1 = boxmax[uVar6];
        pdVar5 = ON_3dPoint::operator[](&local_e8.m_max,(int)uVar6);
        *pdVar5 = dVar1;
        uVar6 = uVar6 + 1;
      } while (uVar4 + 1 != uVar6);
    }
    bVar2 = ON_BoundingBox::IsValid(&local_e8);
    if (bVar2) {
      ON_BoundingBox::Union(&local_e8,this_00);
      this = local_b8;
    }
    else {
      local_e8.m_min.x = (this_00->m_min).x;
      local_e8.m_min.y = (this->m_bbox).m_min.y;
      local_e8.m_min.z = (this->m_bbox).m_min.z;
      local_e8.m_max.x = (this->m_bbox).m_max.x;
      local_e8.m_max.y = (this->m_bbox).m_max.y;
      local_e8.m_max.z = (this->m_bbox).m_max.z;
      this = local_b8;
    }
  }
  uVar4 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
  if (0 < (int)uVar4) {
    uVar7 = 2;
    if (uVar4 - 1 < 2) {
      uVar7 = uVar4 - 1;
    }
    uVar6 = 0;
    do {
      if (boxmin != (double *)0x0) {
        pdVar5 = ON_3dPoint::operator[](&local_e8.m_min,(int)uVar6);
        boxmin[uVar6] = *pdVar5;
      }
      if (boxmax != (double *)0x0) {
        pdVar5 = ON_3dPoint::operator[](&local_e8.m_max,(int)uVar6);
        boxmax[uVar6] = *pdVar5;
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 + 1 != uVar6);
    if (3 < (int)uVar4) {
      uVar6 = 3;
      do {
        if (boxmin != (double *)0x0) {
          boxmin[uVar6] = 0.0;
        }
        if (boxmax != (double *)0x0) {
          boxmax[uVar6] = 0.0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  return true;
}

Assistant:

bool ON_SumSurface::GetBBox( // returns true if successful
       double* boxmin,    // boxmin[dim]
       double* boxmax,    // boxmax[dim]
       bool bGrowBox
       ) const
{
  bool rc = m_bbox.IsValid();
  if (!rc )
  {
    // lazy bounding box evaluation
    ON_BoundingBox bboxA, bboxB;
    if ( m_curve[0] )
      bboxA = m_curve[0]->BoundingBox();
    if ( m_curve[1] )
      bboxB = m_curve[1]->BoundingBox();
    if ( bboxA.IsValid() && bboxB.IsValid() )
    {
      ON_SumSurface* pS = const_cast<ON_SumSurface*>(this);
      pS->m_bbox.m_min = bboxA.m_min + bboxB.m_min + m_basepoint;
      pS->m_bbox.m_max = bboxA.m_max + bboxB.m_max + m_basepoint;
    }
    rc = m_bbox.IsValid();
  }

  if ( rc )
  {
    int dim = Dimension();
    int j;
    ON_BoundingBox bbox;
    if ( bGrowBox && boxmin && boxmax )
    {
      for ( j = 0; j < 3 && j < dim; j++ )
      {
        bbox.m_min[j] = boxmin[j];
        bbox.m_max[j] = boxmax[j];
      }
      if ( !bbox.IsValid() )
        bbox = m_bbox;
      else
        bbox.Union(m_bbox);
    }
    else
      bbox = m_bbox;
    dim = Dimension();
    for ( j = 0; j < 3 && j < dim; j++ )
    {
      if(boxmin) 
        boxmin[j] = bbox.m_min[j];
      if(boxmax) 
        boxmax[j] = bbox.m_max[j];
    }
    for ( j = 3; j < dim; j++ )
    {
      if (boxmin) 
        boxmin[j] = 0.0;
      if (boxmax) 
        boxmax[j] = 0.0;
    }
  }
  return rc;
}